

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedBreakIterator::isBoundary(RuleBasedBreakIterator *this,int32_t offset)

{
  UText *ut;
  UBool UVar1;
  uint in_EAX;
  int32_t iVar2;
  UChar32 UVar3;
  int64_t iVar4;
  int32_t pos;
  bool bVar5;
  UErrorCode status;
  undefined8 uStack_38;
  
  if (offset < 0) {
    (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])(this);
LAB_0029cfde:
    bVar5 = false;
  }
  else {
    ut = &this->fText;
    uStack_38._0_4_ = in_EAX;
    utext_setNativeIndex_63(ut,(ulong)(uint)offset);
    iVar4 = utext_getNativeIndex_63(ut);
    uStack_38 = (ulong)(uint)uStack_38;
    pos = (int32_t)iVar4;
    UVar1 = BreakCache::seek(this->fBreakCache,pos);
    if (UVar1 == '\0') {
      UVar1 = BreakCache::populateNear(this->fBreakCache,pos,(UErrorCode *)((long)&uStack_38 + 4));
      if (UVar1 != '\0') goto LAB_0029cf93;
      bVar5 = false;
    }
    else {
LAB_0029cf93:
      iVar2 = BreakCache::current(this->fBreakCache);
      bVar5 = iVar2 == offset;
    }
    if (bVar5 == true && pos < offset) {
      UVar3 = utext_char32At_63(ut,(ulong)(uint)offset);
      if (UVar3 == -1) goto LAB_0029cfde;
    }
    if (bVar5 == false) {
      (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xd])(this);
    }
  }
  return bVar5;
}

Assistant:

UBool RuleBasedBreakIterator::isBoundary(int32_t offset) {
    // out-of-range indexes are never boundary positions
    if (offset < 0) {
        first();       // For side effects on current position, tag values.
        return FALSE;
    }

    // Adjust offset to be on a code point boundary and not beyond the end of the text.
    // Note that isBoundary() is always false for offsets that are not on code point boundaries.
    // But we still need the side effect of leaving iteration at the following boundary.

    utext_setNativeIndex(&fText, offset);
    int32_t adjustedOffset = static_cast<int32_t>(utext_getNativeIndex(&fText));

    bool result = false;
    UErrorCode status = U_ZERO_ERROR;
    if (fBreakCache->seek(adjustedOffset) || fBreakCache->populateNear(adjustedOffset, status)) {
        result = (fBreakCache->current() == offset);
    }

    if (result && adjustedOffset < offset && utext_char32At(&fText, offset) == U_SENTINEL) {
        // Original offset is beyond the end of the text. Return FALSE, it's not a boundary,
        // but the iteration position remains set to the end of the text, which is a boundary.
        return FALSE;
    }
    if (!result) {
        // Not on a boundary. isBoundary() must leave iterator on the following boundary.
        // Cache->seek(), above, left us on the preceding boundary, so advance one.
        next();
    }
    return result;
}